

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

CuePoint * __thiscall mkvparser::Cues::GetLast(Cues *this)

{
  longlong lVar1;
  long in_RDI;
  CuePoint *pCP;
  CuePoint **pp;
  long index;
  CuePoint *local_8;
  
  if ((*(long *)(in_RDI + 0x28) == 0) || (*(long *)(in_RDI + 0x30) < 1)) {
    local_8 = (CuePoint *)0x0;
  }
  else if (*(long *)(in_RDI + 0x28) == 0) {
    local_8 = (CuePoint *)0x0;
  }
  else {
    local_8 = *(CuePoint **)(*(long *)(in_RDI + 0x28) + (*(long *)(in_RDI + 0x30) + -1) * 8);
    if ((local_8 == (CuePoint *)0x0) || (lVar1 = CuePoint::GetTimeCode(local_8), lVar1 < 0)) {
      local_8 = (CuePoint *)0x0;
    }
  }
  return local_8;
}

Assistant:

const CuePoint* Cues::GetLast() const {
  if (m_cue_points == NULL || m_count <= 0)
    return NULL;

  const long index = m_count - 1;

  CuePoint* const* const pp = m_cue_points;
  if (pp == NULL)
    return NULL;

  CuePoint* const pCP = pp[index];
  if (pCP == NULL || pCP->GetTimeCode() < 0)
    return NULL;

  return pCP;
}